

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

Own<capnp::ClientHook,_std::nullptr_t> __thiscall
capnp::_::PointerReader::getCapability(PointerReader *this)

{
  int *piVar1;
  ClientHook *extraout_RDX;
  long in_RSI;
  Own<capnp::ClientHook,_std::nullptr_t> OVar2;
  Fault f;
  ClientHook *local_60;
  BrokenCapFactory *brokenCapFactory;
  DebugComparison<capnp::_::BrokenCapFactory_*&,_std::nullptr_t> _kjCondition;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> maybeCap;
  
  maybeCap.ptr.disposer = (Disposer *)0x0;
  maybeCap.ptr.ptr = (ClientHook *)0x0;
  _kjCondition.left = &brokenCapFactory;
  brokenCapFactory = globalBrokenCapFactory;
  _kjCondition.right = (void *)0x0;
  _kjCondition.op.content.ptr = " != ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = globalBrokenCapFactory != (BrokenCapFactory *)0x0;
  if (_kjCondition.result) {
    piVar1 = &(anonymous_namespace)::zero;
    if (*(int **)(in_RSI + 0x10) != (int *)0x0) {
      piVar1 = *(int **)(in_RSI + 0x10);
    }
    if (piVar1[1] == 0 && *piVar1 == 0) {
      (**(code **)(*(long *)globalBrokenCapFactory + 8))(this,globalBrokenCapFactory);
    }
    else if (*piVar1 == 3) {
      (**(code **)**(undefined8 **)(in_RSI + 8))(&f);
      _kjCondition.left = (BrokenCapFactory **)f.exception;
      _kjCondition.right = local_60;
      kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
                ((Own<capnp::ClientHook,_std::nullptr_t> *)&f);
      if (local_60 == (ClientHook *)0x0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[45]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x8c4,FAILED,(char *)0x0,"\"Message contains invalid capability pointer.\"",
                   (char (*) [45])"Message contains invalid capability pointer.");
        kj::_::Debug::Fault::~Fault(&f);
        (*(code *)**(undefined8 **)brokenCapFactory)
                  (this,brokenCapFactory,"Calling invalid capability pointer.",0x24);
      }
      else {
        this->segment = (SegmentReader *)f.exception;
        this->capTable = (CapTableReader *)local_60;
        _kjCondition.right = (void *)0x0;
      }
      kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
                ((Own<capnp::ClientHook,_std::nullptr_t> *)&_kjCondition);
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[96]>
                ((Fault *)&_kjCondition,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x8bc,FAILED,(char *)0x0,
                 "\"Schema mismatch: Message contains non-capability pointer where capability pointer was \" \"expected.\""
                 ,(char (*) [96])
                  "Schema mismatch: Message contains non-capability pointer where capability pointer was expected."
                );
      kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
      (*(code *)**(undefined8 **)brokenCapFactory)
                (this,brokenCapFactory,"Calling capability extracted from a non-capability pointer."
                 ,0x3c);
    }
    kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&maybeCap.ptr);
    OVar2.ptr = extraout_RDX;
    OVar2.disposer = (Disposer *)this;
    return OVar2;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::BrokenCapFactory*&,decltype(nullptr)>&,char_const(&)[192]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
             ,0x8b5,FAILED,"brokenCapFactory != nullptr",
             "_kjCondition,\"Trying to read capabilities without ever having created a capability context.  \" \"To read capabilities from a message, you must imbue it with CapReaderContext, or \" \"use the Cap\'n Proto RPC system.\""
             ,&_kjCondition,
             (char (*) [192])
             "Trying to read capabilities without ever having created a capability context.  To read capabilities from a message, you must imbue it with CapReaderContext, or use the Cap\'n Proto RPC system."
            );
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

kj::Own<ClientHook> PointerReader::getCapability() const {
  const WirePointer* ref = pointer == nullptr ? &zero.pointer : pointer;
  return WireHelpers::readCapabilityPointer(segment, capTable, ref, nestingLimit);
}